

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::SetUses(LinearScan *this,Instr *instr,Opnd *opnd)

{
  byte *pbVar1;
  StackSym *stackSym_00;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  StackSym *stackSym;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  switch(OVar3) {
  case OpndKindIntConst:
  case OpndKindAddr:
    LinearScanMD::LegalizeConstantUse(&this->linearScanMD,instr,opnd);
    return;
  case OpndKindSym:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) {
LAB_0058b718:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    stackSym_00 = (StackSym *)opnd[1]._vptr_Opnd;
    if (((stackSym_00->super_Sym).m_kind == SymKindStack) && ((stackSym_00->field_0x19 & 0x10) == 0)
       ) {
      Func::StackAllocate(this->func,stackSym_00,TySize[opnd->m_type]);
      if (stackSym_00->scratch != (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
        pbVar1 = (byte *)((long)stackSym_00->scratch + 0x9d);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    break;
  case OpndKindReg:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0058b718;
      *puVar5 = 0;
    }
LAB_0058b702:
    SetUse(this,instr,(RegOpnd *)opnd);
    return;
  case OpndKindIndir:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_0058b718;
      *puVar5 = 0;
    }
    if ((RegOpnd *)opnd[1]._vptr_Opnd != (RegOpnd *)0x0) {
      SetUse(this,instr,(RegOpnd *)opnd[1]._vptr_Opnd);
    }
    opnd = *(Opnd **)&opnd[1].m_valueType;
    if ((RegOpnd *)opnd != (RegOpnd *)0x0) goto LAB_0058b702;
    break;
  case OpndKindList:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindList) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
      if (!bVar4) goto LAB_0058b718;
      *puVar5 = 0;
    }
    if (0 < *(int *)&opnd[1]._vptr_Opnd) {
      lVar6 = 0;
      do {
        SetUses(this,instr,*(Opnd **)(*(long *)&opnd[1].m_valueType + lVar6 * 8));
        lVar6 = lVar6 + 1;
      } while (lVar6 < *(int *)&opnd[1]._vptr_Opnd);
    }
  }
  return;
}

Assistant:

void
LinearScan::SetUses(IR::Instr *instr, IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        this->SetUse(instr, opnd->AsRegOpnd());
        break;

    case IR::OpndKindSym:
        {
            Sym * sym = opnd->AsSymOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                StackSym* stackSym = sym->AsStackSym();
                if (!stackSym->IsAllocated())
                {
                    func->StackAllocate(stackSym, opnd->GetSize());
                    // StackSym's lifetime is allocated during SCCLiveness::ProcessDst
                    // we might not need to set the flag if the sym is not a dst.
                    if (stackSym->scratch.linearScan.lifetime)
                    {
                        stackSym->scratch.linearScan.lifetime->cantStackPack = true;
                    }
                }
                this->linearScanMD.LegalizeUse(instr, opnd);
            }
        }
        break;
    case IR::OpndKindIndir:
        {
            IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();

            if (indirOpnd->GetBaseOpnd())
            {
                this->SetUse(instr, indirOpnd->GetBaseOpnd());
            }
            if (indirOpnd->GetIndexOpnd())
            {
                this->SetUse(instr, indirOpnd->GetIndexOpnd());
            }
        }
        break;

    case IR::OpndKindList:
    {
        opnd->AsListOpnd()->Map([&](int i, IR::Opnd* opnd)
        {
            this->SetUses(instr, opnd);
        });
    }
    break;

    case IR::OpndKindIntConst:
    case IR::OpndKindAddr:
        this->linearScanMD.LegalizeConstantUse(instr, opnd);
        break;
    };
}